

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O2

bool ft::operator==(list<int,_ft::allocator<int>_> *lhs,list<int,_ft::allocator<int>_> *rhs)

{
  bool bVar1;
  constListIterator<int> local_38;
  constListIterator<int> local_28;
  constListIterator<int> local_18;
  
  if (lhs->m_size == rhs->m_size) {
    local_38.super_listIterator<int>.m_node = lhs->m_head->next;
    local_38.super_listIterator<int>._vptr_listIterator = (_func_int **)&PTR__listIterator_0010dd00;
    local_28.super_listIterator<int>.m_node = lhs->m_tail;
    local_28.super_listIterator<int>._vptr_listIterator = (_func_int **)&PTR__listIterator_0010dd00;
    local_18.super_listIterator<int>.m_node = rhs->m_head->next;
    local_18.super_listIterator<int>._vptr_listIterator = (_func_int **)&PTR__listIterator_0010dd00;
    bVar1 = equal<ft::constListIterator<int>,ft::constListIterator<int>>
                      (&local_38,&local_28,&local_18,(type *)0x0,(type *)0x0);
    return bVar1;
  }
  return false;
}

Assistant:

size_type	size() const { return this->m_size; }